

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigCanon.c
# Opt level: O3

uint Aig_RManSemiCanonicize
               (uint *pOut,uint *pIn,int nVars,char *pCanonPerm,Aig_VSig_t *pSigs,int fReturnIn)

{
  ushort *puVar1;
  Aig_VSig_t *pAVar2;
  int iVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  bool bVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  uint uVar19;
  uint uVar20;
  ulong uVar21;
  uint *pIn_00;
  Aig_VSig_t *pAVar22;
  Aig_VSig_t TempSig;
  uint local_9c;
  uint local_8c;
  
  Aig_RManComputeVSigs(pIn,nVars,pSigs,pOut);
  local_8c = 0;
  local_9c = 0;
  if (0 < nVars) {
    uVar21 = 0;
    local_9c = 0;
    pAVar22 = pSigs;
    do {
      uVar19 = pAVar22->nOnes;
      uVar20 = pAVar22[1].nOnes;
      uVar19 = uVar19 >> 0x18 | (uVar19 & 0xff0000) >> 8 | (uVar19 & 0xff00) << 8 | uVar19 << 0x18;
      uVar20 = uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 | (uVar20 & 0xff00) << 8 | uVar20 << 0x18;
      if (0 < (int)((uint)(uVar19 >= uVar20 && uVar19 != uVar20) - (uint)(uVar19 < uVar20))) {
        pAVar2 = pAVar22 + 1;
        local_9c = local_9c | 1 << ((uint)uVar21 & 0x1f);
        iVar3 = pAVar22->nCofOnes[0xb];
        iVar17 = pAVar22->nOnes;
        iVar18 = pAVar22->nCofOnes[0];
        uVar4 = *(undefined8 *)(pAVar22->nCofOnes + 1);
        uVar5 = *(undefined8 *)(pAVar22->nCofOnes + 3);
        uVar6 = *(undefined8 *)(pAVar22->nCofOnes + 5);
        uVar7 = *(undefined8 *)(pAVar22->nCofOnes + 7);
        uVar8 = *(undefined8 *)(pAVar22->nCofOnes + 9);
        pAVar22->nCofOnes[0xb] = pAVar22[1].nCofOnes[0xb];
        iVar15 = pAVar2->nOnes;
        iVar16 = pAVar2->nCofOnes[0];
        uVar9 = *(undefined8 *)(pAVar22[1].nCofOnes + 1);
        uVar10 = *(undefined8 *)(pAVar22[1].nCofOnes + 3);
        uVar11 = *(undefined8 *)(pAVar22[1].nCofOnes + 5);
        uVar12 = *(undefined8 *)(pAVar22[1].nCofOnes + 9);
        *(undefined8 *)(pAVar22->nCofOnes + 7) = *(undefined8 *)(pAVar22[1].nCofOnes + 7);
        *(undefined8 *)(pAVar22->nCofOnes + 9) = uVar12;
        *(undefined8 *)(pAVar22->nCofOnes + 3) = uVar10;
        *(undefined8 *)(pAVar22->nCofOnes + 5) = uVar11;
        pAVar22->nOnes = iVar15;
        pAVar22->nCofOnes[0] = iVar16;
        *(undefined8 *)(pAVar22->nCofOnes + 1) = uVar9;
        pAVar22[1].nCofOnes[0xb] = iVar3;
        *(undefined8 *)(pAVar22[1].nCofOnes + 7) = uVar7;
        *(undefined8 *)(pAVar22[1].nCofOnes + 9) = uVar8;
        *(undefined8 *)(pAVar22[1].nCofOnes + 3) = uVar5;
        *(undefined8 *)(pAVar22[1].nCofOnes + 5) = uVar6;
        pAVar2->nOnes = iVar17;
        pAVar2->nCofOnes[0] = iVar18;
        *(undefined8 *)(pAVar22[1].nCofOnes + 1) = uVar4;
        Kit_TruthChangePhase(pIn,nVars,(uint)uVar21);
      }
      uVar21 = uVar21 + 1;
      pAVar22 = pAVar22 + 2;
    } while ((uint)nVars != uVar21);
  }
  do {
    if (nVars < 2) break;
    uVar21 = 0;
    bVar14 = false;
    pIn_00 = pIn;
    pAVar22 = pSigs + 2;
    do {
      uVar19 = pAVar22[-2].nOnes;
      uVar20 = pAVar22->nOnes;
      uVar19 = uVar19 >> 0x18 | (uVar19 & 0xff0000) >> 8 | (uVar19 & 0xff00) << 8 | uVar19 << 0x18;
      uVar20 = uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 | (uVar20 & 0xff00) << 8 | uVar20 << 0x18;
      pIn = pIn_00;
      if (0 < (int)((uint)(uVar19 >= uVar20 && uVar19 != uVar20) - (uint)(uVar19 < uVar20))) {
        pAVar2 = pAVar22 + -2;
        local_8c = local_8c + 1;
        puVar1 = (ushort *)(pCanonPerm + uVar21);
        *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
        iVar3 = pAVar22[-2].nCofOnes[0xb];
        iVar17 = pAVar2->nOnes;
        iVar18 = pAVar2->nCofOnes[0];
        uVar4 = *(undefined8 *)(pAVar22[-2].nCofOnes + 1);
        uVar5 = *(undefined8 *)(pAVar22[-2].nCofOnes + 3);
        uVar6 = *(undefined8 *)(pAVar22[-2].nCofOnes + 5);
        uVar7 = *(undefined8 *)(pAVar22[-2].nCofOnes + 7);
        uVar8 = *(undefined8 *)(pAVar22[-2].nCofOnes + 9);
        pAVar22[-2].nCofOnes[0xb] = pAVar22->nCofOnes[0xb];
        iVar15 = pAVar22->nOnes;
        iVar16 = pAVar22->nCofOnes[0];
        uVar9 = *(undefined8 *)(pAVar22->nCofOnes + 1);
        uVar10 = *(undefined8 *)(pAVar22->nCofOnes + 3);
        uVar11 = *(undefined8 *)(pAVar22->nCofOnes + 5);
        uVar12 = *(undefined8 *)(pAVar22->nCofOnes + 9);
        *(undefined8 *)(pAVar22[-2].nCofOnes + 7) = *(undefined8 *)(pAVar22->nCofOnes + 7);
        *(undefined8 *)(pAVar22[-2].nCofOnes + 9) = uVar12;
        *(undefined8 *)(pAVar22[-2].nCofOnes + 3) = uVar10;
        *(undefined8 *)(pAVar22[-2].nCofOnes + 5) = uVar11;
        pAVar2->nOnes = iVar15;
        pAVar2->nCofOnes[0] = iVar16;
        *(undefined8 *)(pAVar22[-2].nCofOnes + 1) = uVar9;
        pAVar22->nCofOnes[0xb] = iVar3;
        *(undefined8 *)(pAVar22->nCofOnes + 7) = uVar7;
        *(undefined8 *)(pAVar22->nCofOnes + 9) = uVar8;
        *(undefined8 *)(pAVar22->nCofOnes + 3) = uVar5;
        *(undefined8 *)(pAVar22->nCofOnes + 5) = uVar6;
        pAVar22->nOnes = iVar17;
        pAVar22->nCofOnes[0] = iVar18;
        *(undefined8 *)(pAVar22->nCofOnes + 1) = uVar4;
        iVar16 = pAVar22[-1].nOnes;
        iVar17 = pAVar22[-1].nCofOnes[0];
        uVar4 = *(undefined8 *)(pAVar22[-1].nCofOnes + 1);
        uVar5 = *(undefined8 *)(pAVar22[-1].nCofOnes + 3);
        uVar6 = *(undefined8 *)(pAVar22[-1].nCofOnes + 5);
        uVar7 = *(undefined8 *)(pAVar22[-1].nCofOnes + 7);
        uVar8 = *(undefined8 *)(pAVar22[-1].nCofOnes + 9);
        iVar3 = pAVar22[-1].nCofOnes[0xb];
        iVar15 = pAVar22[1].nCofOnes[0];
        uVar9 = *(undefined8 *)(pAVar22[1].nCofOnes + 1);
        uVar10 = *(undefined8 *)(pAVar22[1].nCofOnes + 3);
        uVar11 = *(undefined8 *)(pAVar22[1].nCofOnes + 5);
        uVar12 = *(undefined8 *)(pAVar22[1].nCofOnes + 7);
        uVar13 = *(undefined8 *)(pAVar22[1].nCofOnes + 9);
        pAVar22[-1].nOnes = pAVar22[1].nOnes;
        pAVar22[-1].nCofOnes[0] = iVar15;
        *(undefined8 *)(pAVar22[-1].nCofOnes + 1) = uVar9;
        pAVar22[-1].nCofOnes[0xb] = pAVar22[1].nCofOnes[0xb];
        *(undefined8 *)(pAVar22[-1].nCofOnes + 7) = uVar12;
        *(undefined8 *)(pAVar22[-1].nCofOnes + 9) = uVar13;
        *(undefined8 *)(pAVar22[-1].nCofOnes + 3) = uVar10;
        *(undefined8 *)(pAVar22[-1].nCofOnes + 5) = uVar11;
        pAVar22[1].nCofOnes[0xb] = iVar3;
        *(undefined8 *)(pAVar22[1].nCofOnes + 7) = uVar7;
        *(undefined8 *)(pAVar22[1].nCofOnes + 9) = uVar8;
        *(undefined8 *)(pAVar22[1].nCofOnes + 3) = uVar5;
        *(undefined8 *)(pAVar22[1].nCofOnes + 5) = uVar6;
        pAVar22[1].nOnes = iVar16;
        pAVar22[1].nCofOnes[0] = iVar17;
        *(undefined8 *)(pAVar22[1].nCofOnes + 1) = uVar4;
        Kit_TruthSwapAdjacentVars(pOut,pIn_00,nVars,(int)uVar21);
        bVar14 = true;
        pIn = pOut;
        pOut = pIn_00;
      }
      uVar21 = uVar21 + 1;
      pAVar22 = pAVar22 + 2;
      pIn_00 = pIn;
    } while (nVars - 1 != uVar21);
  } while (bVar14);
  if ((local_8c & 1 ^ fReturnIn) != 1) {
    uVar19 = 1 << ((char)nVars - 5U & 0x1f);
    if (nVars < 6) {
      uVar19 = 1;
    }
    if (0 < (int)uVar19) {
      uVar21 = (ulong)uVar19 + 1;
      do {
        pOut[uVar21 - 2] = pIn[uVar21 - 2];
        uVar21 = uVar21 - 1;
      } while (1 < uVar21);
    }
  }
  return local_9c;
}

Assistant:

unsigned Aig_RManSemiCanonicize( unsigned * pOut, unsigned * pIn, int nVars, char * pCanonPerm, Aig_VSig_t * pSigs, int fReturnIn )
{
    Aig_VSig_t TempSig;
    int i, Temp, fChange, Counter;
    unsigned * pTemp, uCanonPhase = 0;
    // collect signatures 
    Aig_RManComputeVSigs( pIn, nVars, pSigs, pOut );
    // canonicize phase
    for ( i = 0; i < nVars; i++ )
    {
//        if ( pStore[2*i+0] <= pStore[2*i+1] )
        if ( Aig_RManCompareSigs( &pSigs[2*i+0], &pSigs[2*i+1], nVars ) <= 0 )
            continue;
        uCanonPhase |= (1 << i);
        TempSig = pSigs[2*i+0];
        pSigs[2*i+0] = pSigs[2*i+1];
        pSigs[2*i+1] = TempSig;
        Kit_TruthChangePhase( pIn, nVars, i );
    }
    // permute
    Counter = 0;
    do {
        fChange = 0;
        for ( i = 0; i < nVars-1; i++ )
        {
//            if ( pStore[2*i] <= pStore[2*(i+1)] )
            if ( Aig_RManCompareSigs( &pSigs[2*i], &pSigs[2*(i+1)], nVars ) <= 0 )
                continue;
            Counter++;
            fChange = 1;

            Temp = pCanonPerm[i];
            pCanonPerm[i] = pCanonPerm[i+1];
            pCanonPerm[i+1] = Temp;

            TempSig = pSigs[2*i];
            pSigs[2*i] = pSigs[2*(i+1)];
            pSigs[2*(i+1)] = TempSig;

            TempSig = pSigs[2*i+1];
            pSigs[2*i+1] = pSigs[2*(i+1)+1];
            pSigs[2*(i+1)+1] = TempSig;

            Kit_TruthSwapAdjacentVars( pOut, pIn, nVars, i );
            pTemp = pIn; pIn = pOut; pOut = pTemp;
        }
    } while ( fChange );

    // swap if it was moved an even number of times
    if ( fReturnIn ^ !(Counter & 1) )
        Kit_TruthCopy( pOut, pIn, nVars );
    return uCanonPhase;
}